

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O3

void __thiscall NaNNUnit::SetInputScale(NaNNUnit *this,NaReal *yMin,NaReal *yMax)

{
  NaReal NVar1;
  uint uVar2;
  uint uVar3;
  NaReal *pNVar4;
  undefined4 *puVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  if ((yMin != (NaReal *)0x0) && (yMax != (NaReal *)0x0)) {
    uVar3 = (this->descr).nInputsRepeat;
    if (uVar3 != 0) {
      uVar8 = 0;
      uVar2 = (this->descr).nInputsNumber;
      do {
        uVar9 = (ulong)uVar2;
        uVar6 = 0;
        if (uVar2 != 0) {
          uVar7 = 0;
          do {
            NVar1 = yMin[uVar7];
            pNVar4 = NaVector::operator[](&(this->InputScaler).min,(int)uVar9 * uVar8 + (int)uVar7);
            *pNVar4 = NVar1;
            NVar1 = yMax[uVar7];
            pNVar4 = NaVector::operator[]
                               (&(this->InputScaler).max,
                                (this->descr).nInputsNumber * uVar8 + (int)uVar7);
            *pNVar4 = NVar1;
            uVar7 = uVar7 + 1;
            uVar6 = (this->descr).nInputsNumber;
            uVar9 = (ulong)uVar6;
          } while (uVar7 < uVar9);
          uVar3 = (this->descr).nInputsRepeat;
        }
        uVar8 = uVar8 + 1;
        uVar2 = uVar6;
      } while (uVar8 < uVar3);
    }
    return;
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&NaException::typeinfo,0);
}

Assistant:

void
NaNNUnit::SetInputScale (const NaReal* yMin, const NaReal* yMax)
{
    if(NULL == yMin || NULL == yMax)
        throw(na_null_pointer);

    unsigned    i, j;
    for(i = 0; i < descr.nInputsRepeat; ++i){
        for(j = 0; j < descr.nInputsNumber; ++j){
            InputScaler.min[i * descr.nInputsNumber + j] = yMin[j];
            InputScaler.max[i * descr.nInputsNumber + j] = yMax[j];
        }
    }
}